

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma.c
# Opt level: O0

void set_gamma(GLFWwindow *window,float value)

{
  GLFWmonitor *local_20;
  GLFWmonitor *monitor;
  float value_local;
  GLFWwindow *window_local;
  
  local_20 = glfwGetWindowMonitor(window);
  if (local_20 == (GLFWmonitor *)0x0) {
    local_20 = glfwGetPrimaryMonitor();
  }
  gamma_value = value;
  printf("Gamma: %f\n",(double)value);
  glfwSetGamma(local_20,gamma_value);
  return;
}

Assistant:

static void set_gamma(GLFWwindow* window, float value)
{
    GLFWmonitor* monitor = glfwGetWindowMonitor(window);
    if (!monitor)
        monitor = glfwGetPrimaryMonitor();

    gamma_value = value;
    printf("Gamma: %f\n", gamma_value);
    glfwSetGamma(monitor, gamma_value);
}